

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::FuncEscapes(ByteCodeGenerator *this,Scope *scope)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FuncInfo *pFVar4;
  
  if (scope != (Scope *)0x0) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pFVar4 = scope->func;
      if (pFVar4 == (FuncInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                           ,0x11fb,"(scope->GetFunc())","scope->GetFunc()");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
        pFVar4 = scope->func;
      }
      pFVar4->field_0xb5 = pFVar4->field_0xb5 | 8;
      scope = scope->enclosingScope;
    } while (scope != (Scope *)0x0);
  }
  if ((this->flags & 0x400) != 0) {
    this->funcEscapes = true;
  }
  return;
}

Assistant:

void ByteCodeGenerator::FuncEscapes(Scope *scope)
{
    while (scope)
    {
        Assert(scope->GetFunc());
        scope->GetFunc()->SetEscapes(true);
        scope = scope->GetEnclosingScope();
    }

    if (this->flags & fscrEval)
    {
        // If a function declared inside eval escapes, we'll need
        // to invalidate the caller's cached scope.
        this->funcEscapes = true;
    }
}